

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::SetBuffer(FileStdio *this,char *buffer,size_t size)

{
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  int status;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_188 [8];
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  undefined1 local_f1 [40];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  
  if (*(long *)(in_RDI + 0xf0) == 0) {
    *(undefined1 *)(in_RDI + 0x110) = 1;
    *(char **)(in_RDI + 0x118) = in_RSI;
    *(size_t *)(in_RDI + 0x120) = in_RDX;
  }
  else {
    *(undefined1 *)(in_RDI + 0x110) = 0;
    *(undefined8 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    if (in_RSI == (char *)0x0) {
      if (in_RDX != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"Toolkit",&local_41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,"transport::file::FileStdio",&local_79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"SetBuffer",&local_a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c8,"buffer size must be 0 when using a NULL buffer",&local_c9);
        helper::Throw<std::invalid_argument>
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
      local_1c = setvbuf(*(FILE **)(in_RDI + 0xf0),(char *)0x0,2,0);
    }
    else {
      local_1c = setvbuf(*(FILE **)(in_RDI + 0xf0),in_RSI,0,in_RDX);
    }
    if (local_1c != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_f1 + 1),"Toolkit",(allocator *)__lhs);
      __rhs = &local_119;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"transport::file::FileStdio",__rhs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"SetBuffer",&local_141);
      std::operator+((char *)in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      std::operator+(__lhs,(char *)__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::__cxx11::string::~string((string *)(local_f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
    }
  }
  return;
}

Assistant:

void FileStdio::SetBuffer(char *buffer, size_t size)
{
    if (!m_File)
    {
        m_DelayedBufferSet = true;
        m_DelayedBuffer = buffer;
        m_DelayedBufferSize = size;
        return;
    }
    m_DelayedBufferSet = false;
    m_DelayedBuffer = nullptr;
    m_DelayedBufferSize = 0;

    int status;
    if (buffer)
    {
        status = std::setvbuf(m_File, buffer, _IOFBF, size);
    }
    else
    {
        if (size != 0)
        {
            helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileStdio",
                                                 "SetBuffer",
                                                 "buffer size must be 0 when using a NULL buffer");
        }
        status = std::setvbuf(m_File, NULL, _IONBF, 0);
    }

    if (status)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "SetBuffer",
                                              "could not set FILE* buffer in file " + m_Name +
                                                  ", in call to stdio setvbuf");
    }
}